

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Help_View.cxx
# Opt level: O0

void __thiscall Fl_Help_View::add_target(Fl_Help_View *this,char *n,int yy)

{
  int iVar1;
  Fl_Help_Target *pFVar2;
  Fl_Help_Target *temp;
  int yy_local;
  char *n_local;
  Fl_Help_View *this_local;
  
  if (this->atargets_ <= this->ntargets_) {
    this->atargets_ = this->atargets_ + 0x10;
    if (this->atargets_ == 0x10) {
      pFVar2 = (Fl_Help_Target *)malloc((long)this->atargets_ * 0x24);
      this->targets_ = pFVar2;
    }
    else {
      pFVar2 = (Fl_Help_Target *)realloc(this->targets_,(long)this->atargets_ * 0x24);
      this->targets_ = pFVar2;
    }
  }
  pFVar2 = this->targets_;
  iVar1 = this->ntargets_;
  pFVar2[iVar1].y = yy;
  fl_strlcpy(pFVar2[iVar1].name,n,0x20);
  this->ntargets_ = this->ntargets_ + 1;
  return;
}

Assistant:

void Fl_Help_View::add_target(const char *n,	// I - Name of target
			      int        yy)	// I - Y position of target
{
  Fl_Help_Target	*temp;			// New target


  if (ntargets_ >= atargets_)
  {
    atargets_ += 16;

    if (atargets_ == 16)
      targets_ = (Fl_Help_Target *)malloc(sizeof(Fl_Help_Target) * atargets_);
    else
      targets_ = (Fl_Help_Target *)realloc(targets_, sizeof(Fl_Help_Target) * atargets_);
  }

  temp = targets_ + ntargets_;

  temp->y = yy;
  strlcpy(temp->name, n, sizeof(temp->name));

  ntargets_ ++;
}